

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask26_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x1a | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 6;
  *puVar1 = in[2] << 0x14 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] >> 0xc;
  *puVar1 = in[3] << 0xe | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[3] >> 0x12;
  *puVar1 = in[4] << 8 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[4] >> 0x18;
  *puVar1 = in[5] << 2 | *puVar1;
  *puVar1 = in[6] << 0x1c | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[6] >> 4;
  *puVar1 = in[7] << 0x16 | *puVar1;
  out[6] = in[7] >> 10;
  return out + 7;
}

Assistant:

uint32_t *__fastpackwithoutmask26_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (26 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (26 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (26 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (26 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (26 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (26 - 16);
  ++in;

  return out + 1;
}